

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

RandomUniformDynamicLayerParams * __thiscall
CoreML::Specification::RandomUniformDynamicLayerParams::New
          (RandomUniformDynamicLayerParams *this,Arena *arena)

{
  RandomUniformDynamicLayerParams *this_00;
  
  this_00 = (RandomUniformDynamicLayerParams *)operator_new(0x28);
  RandomUniformDynamicLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RandomUniformDynamicLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

RandomUniformDynamicLayerParams* RandomUniformDynamicLayerParams::New(::google::protobuf::Arena* arena) const {
  RandomUniformDynamicLayerParams* n = new RandomUniformDynamicLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}